

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void google::protobuf::internal::anon_unknown_58::Register(ExtensionInfo *info)

{
  ctrl_t *pcVar1;
  ctrl_t *pcVar2;
  long lVar3;
  ushort uVar4;
  ushort x;
  undefined1 auVar5 [16];
  MessageLite *pMVar6;
  EnumValidityFuncWithArg *pEVar7;
  void *pvVar8;
  LazyEagerVerifyFnType p_Var9;
  FieldType FVar10;
  bool bVar11;
  LazyAnnotation LVar12;
  char cVar13;
  bool bVar14;
  uint32_t uVar15;
  uint uVar16;
  int iVar17;
  size_t sVar18;
  anon_union_8_1_a8a14541_for_iterator_2 aVar19;
  reference key;
  anon_union_8_1_a8a14541_for_iterator_2 aVar20;
  LogMessage *pLVar21;
  flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  *pfVar22;
  ulong extraout_RDX;
  ulong uVar23;
  ushort uVar24;
  size_t i;
  ulong i_00;
  undefined4 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i match;
  undefined1 auVar29 [16];
  ctrl_t cVar30;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  ctrl_t cVar37;
  ctrl_t cVar38;
  ctrl_t cVar39;
  ctrl_t cVar40;
  ctrl_t cVar41;
  ctrl_t cVar42;
  ctrl_t cVar43;
  ctrl_t cVar44;
  ctrl_t cVar45;
  ctrl_t cVar46;
  ctrl_t cVar47;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  iterator iVar48;
  FindInfo FVar49;
  GetTypeNameReturnType local_a0;
  int *local_80;
  ctrl_t local_78;
  ctrl_t cStack_77;
  ctrl_t cStack_76;
  ctrl_t cStack_75;
  ctrl_t cStack_74;
  ctrl_t cStack_73;
  ctrl_t cStack_72;
  ctrl_t cStack_71;
  ctrl_t cStack_70;
  ctrl_t cStack_6f;
  ctrl_t cStack_6e;
  ctrl_t cStack_6d;
  ctrl_t cStack_6c;
  ctrl_t cStack_6b;
  ctrl_t cStack_6a;
  ctrl_t cStack_69;
  undefined1 local_68 [16];
  iterator local_50;
  const_iterator local_40;
  
  if (((anonymous_namespace)::Register(google::protobuf::internal::ExtensionInfo_const&)::
       local_static_registry == '\0') &&
     (iVar17 = __cxa_guard_acquire(&(anonymous_namespace)::
                                    Register(google::protobuf::internal::ExtensionInfo_const&)::
                                    local_static_registry), iVar17 != 0)) {
    pfVar22 = (flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
               *)operator_new(0x20);
    (pfVar22->
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ).settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0;
    (pfVar22->
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ).settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    (pfVar22->
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ).settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.control =
         (ctrl_t *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
    OnShutdownRun(OnShutdownDelete<absl::lts_20240722::flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>_>
                  ::anon_class_1_0_00000001::__invoke,pfVar22);
    Register::local_static_registry = pfVar22;
    __cxa_guard_release(&(anonymous_namespace)::
                         Register(google::protobuf::internal::ExtensionInfo_const&)::
                         local_static_registry);
  }
  pfVar22 = Register::local_static_registry;
  (anonymous_namespace)::global_registry = Register::local_static_registry;
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  ::AssertHashEqConsistent<google::protobuf::internal::ExtensionInfo>
            (&Register::local_static_registry->
              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ,info);
  local_80 = &info->number;
  sVar18 = absl::lts_20240722::HashOf<const_google::protobuf::MessageLite_*,_int>
                     (&info->message,local_80);
  absl::lts_20240722::container_internal::probe
            ((probe_seq<16UL> *)&local_a0,(CommonFields *)pfVar22,sVar18);
  pcVar2 = (pfVar22->
           super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
           ).settings_.
           super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  auVar26 = ZEXT216(CONCAT11((char)sVar18,(char)sVar18) & 0x7f7f);
  auVar26 = pshuflw(auVar26,auVar26,0);
  uVar25 = auVar26._0_4_;
  auVar26._4_4_ = uVar25;
  auVar26._0_4_ = uVar25;
  auVar26._8_4_ = uVar25;
  auVar26._12_4_ = uVar25;
  aVar19 = (anon_union_8_1_a8a14541_for_iterator_2)local_a0._M_string_length;
  while( true ) {
    pcVar1 = pcVar2 + (long)aVar19;
    auVar27[0] = -(auVar26[0] == *pcVar1);
    auVar27[1] = -(auVar26[1] == pcVar1[1]);
    auVar27[2] = -(auVar26[2] == pcVar1[2]);
    auVar27[3] = -(auVar26[3] == pcVar1[3]);
    auVar27[4] = -(auVar26[4] == pcVar1[4]);
    auVar27[5] = -(auVar26[5] == pcVar1[5]);
    auVar27[6] = -(auVar26[6] == pcVar1[6]);
    auVar27[7] = -(auVar26[7] == pcVar1[7]);
    auVar27[8] = -(auVar26[8] == pcVar1[8]);
    auVar27[9] = -(auVar26[9] == pcVar1[9]);
    auVar27[10] = -(auVar26[10] == pcVar1[10]);
    auVar27[0xb] = -(auVar26[0xb] == pcVar1[0xb]);
    auVar27[0xc] = -(auVar26[0xc] == pcVar1[0xc]);
    auVar27[0xd] = -(auVar26[0xd] == pcVar1[0xd]);
    auVar27[0xe] = -(auVar26[0xe] == pcVar1[0xe]);
    auVar27[0xf] = -(auVar26[0xf] == pcVar1[0xf]);
    cVar30 = *pcVar1;
    cVar33 = pcVar1[1];
    cVar34 = pcVar1[2];
    cVar35 = pcVar1[3];
    cVar36 = pcVar1[4];
    cVar37 = pcVar1[5];
    cVar38 = pcVar1[6];
    cVar39 = pcVar1[7];
    cVar40 = pcVar1[8];
    cVar41 = pcVar1[9];
    cVar42 = pcVar1[10];
    cVar43 = pcVar1[0xb];
    cVar44 = pcVar1[0xc];
    cVar45 = pcVar1[0xd];
    cVar46 = pcVar1[0xe];
    cVar47 = pcVar1[0xf];
    for (uVar24 = (ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar27[0xf] >> 7) << 0xf; uVar24 != 0; uVar24 = uVar24 - 1 & uVar24) {
      local_78 = cVar30;
      cStack_77 = cVar33;
      cStack_76 = cVar34;
      cStack_75 = cVar35;
      cStack_74 = cVar36;
      cStack_73 = cVar37;
      cStack_72 = cVar38;
      cStack_71 = cVar39;
      cStack_70 = cVar40;
      cStack_6f = cVar41;
      cStack_6e = cVar42;
      cStack_6d = cVar43;
      cStack_6c = cVar44;
      cStack_6b = cVar45;
      cStack_6a = cVar46;
      cStack_69 = cVar47;
      local_68 = auVar26;
      uVar15 = absl::lts_20240722::container_internal::TrailingZeros<unsigned_short>(uVar24);
      lVar3 = *(long *)((long)&(pfVar22->
                               super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                               ).settings_.
                               super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_ + 8);
      i = local_a0._M_string_length + (ulong)uVar15 & (ulong)local_a0._M_dataplus._M_p;
      if ((*(MessageLite **)(lVar3 + i * 0x30) == info->message) &&
         (*(int *)(lVar3 + 8 + i * 0x30) == info->number)) goto LAB_0012c55d;
      aVar19 = (anon_union_8_1_a8a14541_for_iterator_2)local_a0._M_string_length;
      auVar26 = local_68;
      cVar30 = local_78;
      cVar33 = cStack_77;
      cVar34 = cStack_76;
      cVar35 = cStack_75;
      cVar36 = cStack_74;
      cVar37 = cStack_73;
      cVar38 = cStack_72;
      cVar39 = cStack_71;
      cVar40 = cStack_70;
      cVar41 = cStack_6f;
      cVar42 = cStack_6e;
      cVar43 = cStack_6d;
      cVar44 = cStack_6c;
      cVar45 = cStack_6b;
      cVar46 = cStack_6a;
      cVar47 = cStack_69;
    }
    auVar31[0] = -(cVar30 == kEmpty);
    auVar31[1] = -(cVar33 == kEmpty);
    auVar31[2] = -(cVar34 == kEmpty);
    auVar31[3] = -(cVar35 == kEmpty);
    auVar31[4] = -(cVar36 == kEmpty);
    auVar31[5] = -(cVar37 == kEmpty);
    auVar31[6] = -(cVar38 == kEmpty);
    auVar31[7] = -(cVar39 == kEmpty);
    auVar31[8] = -(cVar40 == kEmpty);
    auVar31[9] = -(cVar41 == kEmpty);
    auVar31[10] = -(cVar42 == kEmpty);
    auVar31[0xb] = -(cVar43 == kEmpty);
    auVar31[0xc] = -(cVar44 == kEmpty);
    auVar31[0xd] = -(cVar45 == kEmpty);
    auVar31[0xe] = -(cVar46 == kEmpty);
    auVar31[0xf] = -(cVar47 == kEmpty);
    x = (ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
        (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3
        | (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
        (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6
        | (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
        (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9
        | (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
        (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
        (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
        (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
        (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf;
    if (x != 0) break;
    uVar23 = local_a0.field_2._M_allocated_capacity + 0x10;
    aVar19.slot_ = (slot_type *)
                   ((long)&(aVar19.slot_)->field_6 + local_a0.field_2._0_8_ &
                   (ulong)local_a0._M_dataplus._M_p);
    local_a0._M_string_length = (size_type)aVar19.slot_;
    local_a0.field_2._M_allocated_capacity = uVar23;
    if ((pfVar22->
        super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
        ).settings_.
        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
        capacity_ < uVar23) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xef5,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::ExtensionInfo]"
                   );
    }
  }
  cVar13 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                     ((pfVar22->
                      super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                      ).settings_.
                      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                      .
                      super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                      .value.capacity_,sVar18,
                      (pfVar22->
                      super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                      ).settings_.
                      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                      .
                      super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                      .value.heap_or_soo_.heap.control);
  if (cVar13 == '\0') {
    uVar16 = absl::lts_20240722::container_internal::TrailingZeros<unsigned_short>(x);
  }
  else {
    uVar4 = 0xf;
    if (x != 0) {
      for (; x >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar16 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
  }
  FVar49.offset = local_a0._M_string_length + (ulong)uVar16 & (ulong)local_a0._M_dataplus._M_p;
  FVar49.probe_length = local_a0.field_2._M_allocated_capacity;
  i = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                ((CommonFields *)pfVar22,sVar18,FVar49,
                 (PolicyFunctions *)
                 absl::lts_20240722::container_internal::
                 raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>
                 ::GetPolicyFunctions()::value);
LAB_0012c55d:
  local_50 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ::iterator_at(&pfVar22->
                            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                           ,i);
  aVar19 = local_50.field_1;
  if (uVar24 != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x5e);
    pLVar21 = absl::lts_20240722::log_internal::LogMessage::operator<<
                        ((LogMessage *)&local_50,
                         (char (*) [44])"Multiple extension registrations for type \"");
    MessageLite::GetTypeName_abi_cxx11_(&local_a0,info->message);
    pLVar21 = (LogMessage *)
              absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar21,(string *)&local_a0);
    pLVar21 = absl::lts_20240722::log_internal::LogMessage::operator<<
                        (pLVar21,(char (*) [17])"\", field number ");
    pLVar21 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar21,*local_80);
    absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar21,(char (*) [2])0x1834af);
    std::__cxx11::string::~string((string *)&local_a0);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  pMVar6 = info->message;
  iVar17 = info->number;
  FVar10 = info->type;
  bVar14 = info->is_repeated;
  bVar11 = info->is_packed;
  LVar12 = info->is_lazy;
  pEVar7 = (info->field_6).enum_validity_check.func;
  pvVar8 = (info->field_6).enum_validity_check.arg;
  p_Var9 = info->lazy_eager_verify_func;
  (aVar19.slot_)->descriptor = info->descriptor;
  (aVar19.slot_)->lazy_eager_verify_func = p_Var9;
  ((aVar19.slot_)->field_6).enum_validity_check.func = pEVar7;
  ((aVar19.slot_)->field_6).enum_validity_check.arg = pvVar8;
  (aVar19.slot_)->message = pMVar6;
  *(int *)((long)aVar19 + 8) = iVar17;
  *(FieldType *)((long)aVar19 + 0xc) = FVar10;
  *(bool *)((long)aVar19 + 0xd) = bVar14;
  *(bool *)((long)aVar19 + 0xe) = bVar11;
  *(LazyAnnotation *)((long)aVar19 + 0xf) = LVar12;
  local_80 = (int *)local_50.ctrl_;
  key = absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
        ::iterator::operator*(&local_50);
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  ::AssertHashEqConsistent<google::protobuf::internal::ExtensionInfo>
            (&pfVar22->
              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ,key);
  sVar18 = absl::lts_20240722::HashOf<const_google::protobuf::MessageLite_*,_int>
                     (&key->message,&key->number);
  absl::lts_20240722::container_internal::probe
            ((probe_seq<16UL> *)&local_a0,(CommonFields *)pfVar22,sVar18);
  pcVar2 = (pfVar22->
           super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
           ).settings_.
           super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  auVar26 = ZEXT416((CONCAT11((char)sVar18,(char)sVar18) & 0xff7f) & 0xffff7fff);
  auVar26 = pshuflw(auVar26,auVar26,0);
  uVar25 = auVar26._0_4_;
  auVar29._4_4_ = uVar25;
  auVar29._0_4_ = uVar25;
  auVar29._8_4_ = uVar25;
  auVar29._12_4_ = uVar25;
  aVar20 = (anon_union_8_1_a8a14541_for_iterator_2)local_a0._M_string_length;
  uVar23 = extraout_RDX;
  do {
    pcVar1 = pcVar2 + (long)aVar20;
    auVar28[0] = -(auVar29[0] == *pcVar1);
    auVar28[1] = -(auVar29[1] == pcVar1[1]);
    auVar28[2] = -(auVar29[2] == pcVar1[2]);
    auVar28[3] = -(auVar29[3] == pcVar1[3]);
    auVar28[4] = -(auVar29[4] == pcVar1[4]);
    auVar28[5] = -(auVar29[5] == pcVar1[5]);
    auVar28[6] = -(auVar29[6] == pcVar1[6]);
    auVar28[7] = -(auVar29[7] == pcVar1[7]);
    auVar28[8] = -(auVar29[8] == pcVar1[8]);
    auVar28[9] = -(auVar29[9] == pcVar1[9]);
    auVar28[10] = -(auVar29[10] == pcVar1[10]);
    auVar28[0xb] = -(auVar29[0xb] == pcVar1[0xb]);
    auVar28[0xc] = -(auVar29[0xc] == pcVar1[0xc]);
    auVar28[0xd] = -(auVar29[0xd] == pcVar1[0xd]);
    auVar28[0xe] = -(auVar29[0xe] == pcVar1[0xe]);
    auVar28[0xf] = -(auVar29[0xf] == pcVar1[0xf]);
    cVar30 = *pcVar1;
    cVar33 = pcVar1[1];
    cVar34 = pcVar1[2];
    cVar35 = pcVar1[3];
    cVar36 = pcVar1[4];
    cVar37 = pcVar1[5];
    cVar38 = pcVar1[6];
    cVar39 = pcVar1[7];
    cVar40 = pcVar1[8];
    cVar41 = pcVar1[9];
    cVar42 = pcVar1[10];
    cVar43 = pcVar1[0xb];
    cVar44 = pcVar1[0xc];
    cVar45 = pcVar1[0xd];
    cVar46 = pcVar1[0xe];
    cVar47 = pcVar1[0xf];
    for (uVar24 = (ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar28[0xf] >> 7) << 0xf; auVar5._8_8_ = 0, auVar5._0_8_ = uVar23,
        iVar48 = (iterator)(auVar5 << 0x40), uVar24 != 0; uVar24 = uVar24 - 1 & uVar24) {
      local_78 = cVar30;
      cStack_77 = cVar33;
      cStack_76 = cVar34;
      cStack_75 = cVar35;
      cStack_74 = cVar36;
      cStack_73 = cVar37;
      cStack_72 = cVar38;
      cStack_71 = cVar39;
      cStack_70 = cVar40;
      cStack_6f = cVar41;
      cStack_6e = cVar42;
      cStack_6d = cVar43;
      cStack_6c = cVar44;
      cStack_6b = cVar45;
      cStack_6a = cVar46;
      cStack_69 = cVar47;
      local_68 = auVar29;
      uVar15 = absl::lts_20240722::container_internal::TrailingZeros<unsigned_short>(uVar24);
      lVar3 = *(long *)((long)&(pfVar22->
                               super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                               ).settings_.
                               super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_ + 8);
      i_00 = local_a0._M_string_length + (ulong)uVar15 & (ulong)local_a0._M_dataplus._M_p;
      uVar23 = i_00 * 0x30;
      if ((*(MessageLite **)(lVar3 + uVar23) == key->message) &&
         (*(int *)(lVar3 + 8 + uVar23) == key->number)) {
        iVar48 = absl::lts_20240722::container_internal::
                 raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                 ::iterator_at(&pfVar22->
                                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                               ,i_00);
        goto LAB_0012c6cc;
      }
      aVar20 = (anon_union_8_1_a8a14541_for_iterator_2)local_a0._M_string_length;
      auVar29 = local_68;
      cVar30 = local_78;
      cVar33 = cStack_77;
      cVar34 = cStack_76;
      cVar35 = cStack_75;
      cVar36 = cStack_74;
      cVar37 = cStack_73;
      cVar38 = cStack_72;
      cVar39 = cStack_71;
      cVar40 = cStack_70;
      cVar41 = cStack_6f;
      cVar42 = cStack_6e;
      cVar43 = cStack_6d;
      cVar44 = cStack_6c;
      cVar45 = cStack_6b;
      cVar46 = cStack_6a;
      cVar47 = cStack_69;
    }
    auVar32[0] = -(cVar30 == kEmpty);
    auVar32[1] = -(cVar33 == kEmpty);
    auVar32[2] = -(cVar34 == kEmpty);
    auVar32[3] = -(cVar35 == kEmpty);
    auVar32[4] = -(cVar36 == kEmpty);
    auVar32[5] = -(cVar37 == kEmpty);
    auVar32[6] = -(cVar38 == kEmpty);
    auVar32[7] = -(cVar39 == kEmpty);
    auVar32[8] = -(cVar40 == kEmpty);
    auVar32[9] = -(cVar41 == kEmpty);
    auVar32[10] = -(cVar42 == kEmpty);
    auVar32[0xb] = -(cVar43 == kEmpty);
    auVar32[0xc] = -(cVar44 == kEmpty);
    auVar32[0xd] = -(cVar45 == kEmpty);
    auVar32[0xe] = -(cVar46 == kEmpty);
    auVar32[0xf] = -(cVar47 == kEmpty);
    if ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar32 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar32 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar32 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar32 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar32 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar32 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar32 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar32 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar32 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar32 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar32 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar47 == kEmpty) {
LAB_0012c6cc:
      local_40.inner_.ctrl_ = (ctrl_t *)local_80;
      local_a0._0_16_ = iVar48;
      local_40.inner_.field_1 = aVar19;
      bVar14 = absl::lts_20240722::container_internal::operator==
                         ((const_iterator *)&local_a0,&local_40);
      if (!bVar14) {
        __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf3f,
                      "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, Args = <const google::protobuf::internal::ExtensionInfo &>]"
                     );
      }
      return;
    }
    uVar23 = local_a0.field_2._M_allocated_capacity + 0x10;
    aVar20.slot_ = (slot_type *)
                   ((long)&(aVar20.slot_)->field_6 + local_a0.field_2._0_8_ &
                   (ulong)local_a0._M_dataplus._M_p);
    local_a0._M_string_length = (size_type)aVar20.slot_;
    local_a0.field_2._M_allocated_capacity = uVar23;
    if ((pfVar22->
        super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
        ).settings_.
        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
        capacity_ < uVar23) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xdbd,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::ExtensionInfo]"
                   );
    }
  } while( true );
}

Assistant:

void Register(const ExtensionInfo& info) {
  static auto local_static_registry = OnShutdownDelete(new ExtensionRegistry);
  global_registry = local_static_registry;
  if (!local_static_registry->insert(info).second) {
    ABSL_LOG(FATAL) << "Multiple extension registrations for type \""
                    << info.message->GetTypeName() << "\", field number "
                    << info.number << ".";
  }
}